

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

Node * __thiscall wasm::DataFlow::Graph::doVisitIf(Graph *this,If *curr)

{
  Locals *__x;
  mapped_type pEVar1;
  mapped_type *ppEVar2;
  Node *condition;
  undefined1 local_78 [8];
  Locals afterIfFalseState;
  Locals afterIfTrueState;
  Locals initialState;
  
  pEVar1 = this->parent;
  afterIfTrueState.
  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)curr;
  ppEVar2 = std::__detail::
            _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->expressionParentMap,
                         (key_type *)
                         &afterIfTrueState.
                          super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  *ppEVar2 = pEVar1;
  this->parent = (Expression *)curr;
  condition = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                        ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,
                         curr->condition);
  if (condition != (Node *)0x0) {
    __x = &this->locals;
    std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::vector
              ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)
               &afterIfTrueState.
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,__x);
    Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
              ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->ifTrue);
    std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::vector
              ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)
               &afterIfFalseState.
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,__x);
    if (curr->ifFalse == (Expression *)0x0) {
      mergeIf(this,(Locals *)
                   &afterIfTrueState.
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
              (Locals *)
              &afterIfFalseState.
               super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,condition,(Expression *)curr,__x);
    }
    else {
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::operator=
                (__x,(vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)
                     &afterIfTrueState.
                      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->ifFalse);
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::vector
                ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)local_78
                 ,__x);
      mergeIf(this,(Locals *)
                   &afterIfFalseState.
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(Locals *)local_78,condition,
              (Expression *)curr,__x);
      if (local_78 != (undefined1  [8])0x0) {
        operator_delete((void *)local_78,
                        (long)afterIfFalseState.
                              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_78);
      }
    }
    this->parent = pEVar1;
    if (afterIfFalseState.
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(afterIfFalseState.
                      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)afterIfTrueState.
                            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)afterIfFalseState.
                            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (afterIfTrueState.
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(afterIfTrueState.
                      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)initialState.
                            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)afterIfTrueState.
                            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    return &this->bad;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/dataflow/graph.h"
                ,0x10a,"Node *wasm::DataFlow::Graph::doVisitIf(If *)");
}

Assistant:

Node* doVisitIf(If* curr) {
    auto* oldParent = parent;
    expressionParentMap[curr] = oldParent;
    parent = curr;
    // Set up the condition.
    Node* condition = visit(curr->condition);
    assert(condition);
    // Handle the contents.
    auto initialState = locals;
    visit(curr->ifTrue);
    auto afterIfTrueState = locals;
    if (curr->ifFalse) {
      locals = initialState;
      visit(curr->ifFalse);
      auto afterIfFalseState = locals; // TODO: optimize
      mergeIf(afterIfTrueState, afterIfFalseState, condition, curr, locals);
    } else {
      mergeIf(initialState, afterIfTrueState, condition, curr, locals);
    }
    parent = oldParent;
    return &bad;
  }